

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

void __thiscall r_comp::Preprocessor::initialize(Preprocessor *this,Metadata *metadata)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar3;
  pointer pcVar4;
  Iteration IVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  bool bVar6;
  int iVar7;
  ReturnType t;
  int iVar8;
  mapped_type *pmVar9;
  long lVar10;
  mapped_type *pmVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  Class *pCVar14;
  mapped_type *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  Atom *this_04;
  string *psVar15;
  pointer psVar16;
  Atom atom;
  string function_name;
  Ptr s;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> members;
  string base_class;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> r_set;
  string class_name;
  list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  tpl_args_1;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> r_type;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> r_xpr;
  undefined4 local_42c;
  key_type local_428;
  element_type *local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_3f8;
  Metadata *local_3e0;
  undefined1 local_3d8 [8];
  _Alloc_hider local_3d0;
  undefined1 local_3c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  pointer local_3a0;
  _Alloc_hider local_398;
  char local_388 [16];
  undefined1 local_378 [8];
  pointer pSStack_370;
  pointer local_368;
  _Alloc_hider local_360;
  Atom local_354 [4];
  Atom local_350 [4];
  Atom local_34c [4];
  Atom local_348 [4];
  Atom local_344 [4];
  Atom local_340 [4];
  Atom local_33c [4];
  undefined1 local_338 [36];
  int local_314;
  vector<r_comp::Class> *local_310;
  ulong local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  Ptr local_2f0;
  Ptr local_2e0;
  Ptr local_2d0;
  _List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  local_2c0;
  value_type local_2a8;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_288;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_258;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_248;
  pointer local_240;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  value_type local_198;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  string local_158;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_138;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_118;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_100;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_e8;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_d0;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_b8;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_a0;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_88;
  string local_70;
  string local_50;
  
  this->m_metadata = metadata;
  this->m_classOpcode = 0;
  local_138.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3e0 = metadata;
  r_code::Atom::Object((ushort)local_33c,'\0');
  std::__cxx11::string::string((string *)&local_50,Class::Expression,(allocator *)local_378);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            (&local_100,&local_138);
  Class::Class((Class *)local_3d8,local_33c,&local_50,&local_100,ANY);
  std::__cxx11::string::string((string *)&local_428,Class::Expression,(allocator *)&local_288);
  pmVar9 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)local_3e0,&local_428);
  r_code::Atom::operator=(&pmVar9->atom,(Atom *)local_3d8);
  std::__cxx11::string::operator=((string *)&pmVar9->str_opcode,(string *)&local_3d0);
  local_338._16_8_ =
       (pmVar9->things_to_read).
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_338._0_8_ =
       (pmVar9->things_to_read).
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_338._8_8_ =
       (pmVar9->things_to_read).
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (pmVar9->things_to_read).
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_3b0._M_allocated_capacity;
  (pmVar9->things_to_read).
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_3b0._8_8_;
  (pmVar9->things_to_read).
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_3a0;
  local_3b0._M_allocated_capacity = 0;
  local_3b0._8_8_ = (pointer)0x0;
  local_3a0 = (pointer)0x0;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)local_338)
  ;
  *(pointer *)&pmVar9->type = local_398._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p);
  }
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)&local_3b0
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_p != &local_3c0) {
    operator_delete(local_3d0._M_p);
  }
  r_code::Atom::~Atom((Atom *)local_3d8);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  r_code::Atom::~Atom(local_33c);
  iVar7 = *(int *)&this->m_classOpcode + 1;
  this->m_classOpcode = (uint16_t)iVar7;
  local_288.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  r_code::Atom::Object((ushort)local_340,(uchar)iVar7);
  std::__cxx11::string::string((string *)&local_70,Class::Type,(allocator *)local_378);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            (&local_118,&local_288);
  Class::Class((Class *)local_3d8,local_340,&local_70,&local_118,ANY);
  std::__cxx11::string::string((string *)&local_428,Class::Type,(allocator *)&local_3f8);
  pmVar9 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)local_3e0,&local_428);
  r_code::Atom::operator=(&pmVar9->atom,(Atom *)local_3d8);
  std::__cxx11::string::operator=((string *)&pmVar9->str_opcode,(string *)&local_3d0);
  local_338._16_8_ =
       (pmVar9->things_to_read).
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_338._0_8_ =
       (pmVar9->things_to_read).
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_338._8_8_ =
       (pmVar9->things_to_read).
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (pmVar9->things_to_read).
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_3b0._M_allocated_capacity;
  (pmVar9->things_to_read).
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_3b0._8_8_;
  (pmVar9->things_to_read).
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_3a0;
  local_3b0._M_allocated_capacity = 0;
  local_3b0._8_8_ = (pointer)0x0;
  local_3a0 = (pointer)0x0;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)local_338)
  ;
  *(pointer *)&pmVar9->type = local_398._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p);
  }
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)&local_3b0
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_p != &local_3c0) {
    operator_delete(local_3d0._M_p);
  }
  r_code::Atom::~Atom((Atom *)local_3d8);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  r_code::Atom::~Atom(local_340);
  this->m_classOpcode = this->m_classOpcode + 1;
  peVar2 = (this->root).super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar16 = (peVar2->args).
            super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_240 = *(pointer *)
               ((long)&(peVar2->args).
                       super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                       ._M_impl.super__Vector_impl_data + 8);
  if (psVar16 != local_240) {
    local_260 = &local_3e0->function_names;
    local_248 = &local_3e0->operator_names;
    local_258 = &local_3e0->class_names;
    local_310 = &local_3e0->classes_by_opcodes;
    local_268 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&local_3e0->sys_classes;
    local_250 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->m_templateClasses;
    local_308 = 0;
    local_314 = 0;
    local_360._M_p = (pointer)this;
    do {
      peVar2 = (psVar16->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      this_00 = (psVar16->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (peVar2->type == Directive) {
        puVar3 = *(undefined8 **)
                  &(peVar2->args).
                   super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                   ._M_impl;
        local_408 = (element_type *)*puVar3;
        local_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[1];
        if ((Preprocessor *)local_400._M_pi != (Preprocessor *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(((Preprocessor *)local_400._M_pi)->root).
                      super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var1 = &(((Preprocessor *)local_400._M_pi)->root).
                      super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          }
        }
        local_3f8.
        super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3f8.
        super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_3f8.
        super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        psVar15 = &peVar2->cmd;
        iVar7 = std::__cxx11::string::compare((char *)psVar15);
        if (iVar7 == 0) {
          local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"[]","");
          local_338._0_8_ = local_338 + 0x10;
          pcVar4 = (local_408->cmd)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_338,pcVar4,pcVar4 + (local_408->cmd)._M_string_length);
          lVar10 = std::__cxx11::string::find((char *)local_338,(ulong)local_428._M_dataplus._M_p,0)
          ;
          if (lVar10 != -1) {
            std::__cxx11::string::substr((ulong)local_3d8,(ulong)local_338);
            std::__cxx11::string::operator=((string *)local_338,(string *)local_3d8);
            if (local_3d8 != (undefined1  [8])local_3c8) {
              operator_delete((void *)local_3d8);
            }
          }
          local_2d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_408;
          local_2d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = local_400._M_pi;
          if ((Preprocessor *)local_400._M_pi != (Preprocessor *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &(local_400._M_pi)->_M_use_count)->_M_pi =
                   *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                            &(local_400._M_pi)->_M_use_count)->_M_pi + 1;
              UNLOCK();
            }
            else {
              *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &(local_400._M_pi)->_M_use_count)->_M_pi =
                   *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                            &(local_400._M_pi)->_M_use_count)->_M_pi + 1;
            }
          }
          bVar6 = isTemplateClass(this,&local_2d0);
          if ((Preprocessor *)
              local_2d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (Preprocessor *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_2d0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (bVar6) {
            pmVar11 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<r_comp::RepliStruct>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_250,(key_type *)local_338);
            (pmVar11->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                 local_408;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(pmVar11->
                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount,&local_400);
          }
          else {
            local_2c0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_2c0;
            local_2c0._M_impl._M_node._M_size = 0;
            local_2e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_408;
            local_2e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = local_400._M_pi;
            if ((Preprocessor *)local_400._M_pi != (Preprocessor *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &(local_400._M_pi)->_M_use_count)->_M_pi =
                     *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                              &(local_400._M_pi)->_M_use_count)->_M_pi + 1;
                UNLOCK();
              }
              else {
                *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &(local_400._M_pi)->_M_use_count)->_M_pi =
                     *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                              &(local_400._M_pi)->_M_use_count)->_M_pi + 1;
              }
            }
            local_2c0._M_impl._M_node.super__List_node_base._M_prev =
                 local_2c0._M_impl._M_node.super__List_node_base._M_next;
            getMembers(this,&local_2e0,&local_3f8,
                       (list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                        *)&local_2c0,false);
            if ((Preprocessor *)
                local_2e0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (Preprocessor *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_2e0.
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            r_code::Atom::Atom((Atom *)&local_42c,0xffffffff);
            iVar7 = std::__cxx11::string::compare(local_338);
            if (iVar7 == 0) {
              r_code::Atom::Group((ushort)(Atom *)local_3d8,(uchar)this->m_classOpcode);
              r_code::Atom::operator=((Atom *)&local_42c,(Atom *)local_3d8);
            }
            else {
              iVar7 = std::__cxx11::string::compare(local_338);
              if (iVar7 == 0) {
                r_code::Atom::InstantiatedProgram
                          ((ushort)(Atom *)local_3d8,(uchar)this->m_classOpcode);
                r_code::Atom::operator=((Atom *)&local_42c,(Atom *)local_3d8);
              }
              else {
                iVar7 = std::__cxx11::string::compare(local_338);
                if (iVar7 == 0) {
                  r_code::Atom::InstantiatedCPPProgram
                            ((ushort)(Atom *)local_3d8,(uchar)this->m_classOpcode);
                  r_code::Atom::operator=((Atom *)&local_42c,(Atom *)local_3d8);
                }
                else {
                  iVar7 = std::__cxx11::string::compare(local_338);
                  if (iVar7 == 0) {
                    r_code::Atom::CompositeState
                              ((ushort)(Atom *)local_3d8,(uchar)this->m_classOpcode);
                    r_code::Atom::operator=((Atom *)&local_42c,(Atom *)local_3d8);
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare(local_338);
                    if (iVar7 == 0) {
                      r_code::Atom::Model((ushort)(Atom *)local_3d8,(uchar)this->m_classOpcode);
                      r_code::Atom::operator=((Atom *)&local_42c,(Atom *)local_3d8);
                    }
                    else {
                      lVar12 = std::__cxx11::string::find(local_338,0x13e7a9,0);
                      if (lVar12 == -1) {
                        r_code::Atom::Object((ushort)(Atom *)local_3d8,(uchar)this->m_classOpcode);
                        r_code::Atom::operator=((Atom *)&local_42c,(Atom *)local_3d8);
                      }
                      else {
                        r_code::Atom::Marker((ushort)(Atom *)local_3d8,(uchar)this->m_classOpcode);
                        r_code::Atom::operator=((Atom *)&local_42c,(Atom *)local_3d8);
                      }
                    }
                  }
                }
              }
            }
            r_code::Atom::~Atom((Atom *)local_3d8);
            iVar7 = 2;
            if (lVar10 == -1) {
              peVar2 = (((local_408->args).
                         super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_3d8 = (undefined1  [8])local_3c8;
              lVar10 = *(long *)&(peVar2->cmd)._M_dataplus;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3d8,lVar10,*(size_type *)((long)&peVar2->cmd + 8) + lVar10)
              ;
              iVar7 = std::__cxx11::string::compare((char *)local_3d8);
              if ((iVar7 == 0) || (iVar7 = std::__cxx11::string::compare(local_3d8), iVar7 == 0)) {
LAB_0013796c:
                iVar7 = 1;
              }
              else {
                iVar8 = std::__cxx11::string::compare(local_3d8);
                iVar7 = 0;
                if (iVar8 == 0) goto LAB_0013796c;
              }
              if (local_3d8 != (undefined1  [8])local_3c8) {
                operator_delete((void *)local_3d8);
              }
            }
            pbVar13 = r_code::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator[](local_258,(ulong)this->m_classOpcode);
            std::__cxx11::string::_M_assign((string *)pbVar13);
            if (iVar7 == 0) {
              local_348[0] = (Atom)(undefined1)local_42c;
              local_348[1] = (Atom)local_42c._1_1_;
              local_348[2] = (Atom)local_42c._2_1_;
              local_348[3] = (Atom)local_42c._3_1_;
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d8,local_338._0_8_,
                         (pointer)(local_338._0_8_ + (long)(_Read *)local_338._8_8_));
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                        (&local_a0,&local_3f8);
              Class::Class((Class *)local_3d8,local_348,&local_1d8,&local_a0,ANY);
              pmVar9 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)local_3e0,(key_type *)local_338);
              r_code::Atom::operator=(&pmVar9->atom,(Atom *)local_3d8);
              std::__cxx11::string::operator=((string *)&pmVar9->str_opcode,(string *)&local_3d0);
              local_368 = (pmVar9->things_to_read).
                          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_378 = (undefined1  [8])
                          (pmVar9->things_to_read).
                          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              pSStack_370 = (pmVar9->things_to_read).
                            super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              (pmVar9->things_to_read).
              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_3b0._M_allocated_capacity;
              (pmVar9->things_to_read).
              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_3b0._8_8_;
              (pmVar9->things_to_read).
              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = local_3a0;
              local_3b0._M_allocated_capacity = 0;
              local_3b0._8_8_ = (pointer)0x0;
              local_3a0 = (pointer)0x0;
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                      local_378);
              *(pointer *)&pmVar9->type = local_398._M_p;
              pCVar14 = r_code::vector<r_comp::Class>::operator[]
                                  (local_310,(ulong)*(ushort *)(local_360._M_p + 0x18));
              r_code::Atom::operator=(&pCVar14->atom,&pmVar9->atom);
              std::__cxx11::string::_M_assign((string *)&pCVar14->str_opcode);
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              operator=(&pCVar14->things_to_read,&pmVar9->things_to_read);
              IVar5 = pmVar9->use_as;
              pCVar14->type = pmVar9->type;
              pCVar14->use_as = IVar5;
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                      &local_3b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_p != &local_3c0) {
                operator_delete(local_3d0._M_p);
              }
              r_code::Atom::~Atom((Atom *)local_3d8);
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector(&local_a0);
              this = (Preprocessor *)local_360._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p);
              }
              this_04 = local_348;
            }
            else if (iVar7 == 2) {
              r_code::Atom::SSet((ushort)local_34c,(uchar)this->m_classOpcode);
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1f8,local_338._0_8_,
                         (pointer)(local_338._0_8_ + (long)(_Read *)local_338._8_8_));
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                        (&local_b8,&local_3f8);
              Class::Class((Class *)local_3d8,local_34c,&local_1f8,&local_b8,ANY);
              pmVar9 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)local_3e0,(key_type *)local_338);
              r_code::Atom::operator=(&pmVar9->atom,(Atom *)local_3d8);
              std::__cxx11::string::operator=((string *)&pmVar9->str_opcode,(string *)&local_3d0);
              local_368 = (pmVar9->things_to_read).
                          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_378 = (undefined1  [8])
                          (pmVar9->things_to_read).
                          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              pSStack_370 = (pmVar9->things_to_read).
                            super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              (pmVar9->things_to_read).
              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_3b0._M_allocated_capacity;
              (pmVar9->things_to_read).
              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_3b0._8_8_;
              (pmVar9->things_to_read).
              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = local_3a0;
              local_3b0._M_allocated_capacity = 0;
              local_3b0._8_8_ = (pointer)0x0;
              local_3a0 = (pointer)0x0;
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                      local_378);
              *(pointer *)&pmVar9->type = local_398._M_p;
              pCVar14 = r_code::vector<r_comp::Class>::operator[]
                                  (local_310,(ulong)*(ushort *)(local_360._M_p + 0x18));
              r_code::Atom::operator=(&pCVar14->atom,&pmVar9->atom);
              std::__cxx11::string::_M_assign((string *)&pCVar14->str_opcode);
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              operator=(&pCVar14->things_to_read,&pmVar9->things_to_read);
              IVar5 = pmVar9->use_as;
              pCVar14->type = pmVar9->type;
              pCVar14->use_as = IVar5;
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                      &local_3b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_p != &local_3c0) {
                operator_delete(local_3d0._M_p);
              }
              r_code::Atom::~Atom((Atom *)local_3d8);
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector(&local_b8);
              this = (Preprocessor *)local_360._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p);
              }
              this_04 = local_34c;
            }
            else {
              local_344[0] = (Atom)(undefined1)local_42c;
              local_344[1] = (Atom)local_42c._1_1_;
              local_344[2] = (Atom)local_42c._2_1_;
              local_344[3] = (Atom)local_42c._3_1_;
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1b8,local_338._0_8_,
                         (pointer)(local_338._0_8_ + (long)(_Read *)local_338._8_8_));
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                        (&local_88,&local_3f8);
              Class::Class((Class *)local_3d8,local_344,&local_1b8,&local_88,ANY);
              pmVar9 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[](local_268,(key_type *)local_338);
              r_code::Atom::operator=(&pmVar9->atom,(Atom *)local_3d8);
              std::__cxx11::string::operator=((string *)&pmVar9->str_opcode,(string *)&local_3d0);
              local_368 = (pmVar9->things_to_read).
                          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_378 = (undefined1  [8])
                          (pmVar9->things_to_read).
                          super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              pSStack_370 = (pmVar9->things_to_read).
                            super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              (pmVar9->things_to_read).
              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_3b0._M_allocated_capacity;
              (pmVar9->things_to_read).
              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_3b0._8_8_;
              (pmVar9->things_to_read).
              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = local_3a0;
              local_3b0._M_allocated_capacity = 0;
              local_3b0._8_8_ = (pointer)0x0;
              local_3a0 = (pointer)0x0;
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                      local_378);
              *(pointer *)&pmVar9->type = local_398._M_p;
              this_02 = std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_3e0,(key_type *)local_338);
              r_code::Atom::operator=(&this_02->atom,&pmVar9->atom);
              std::__cxx11::string::_M_assign((string *)&this_02->str_opcode);
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              operator=(&this_02->things_to_read,&pmVar9->things_to_read);
              IVar5 = pmVar9->use_as;
              this_02->type = pmVar9->type;
              this_02->use_as = IVar5;
              pCVar14 = r_code::vector<r_comp::Class>::operator[]
                                  (local_310,(ulong)*(ushort *)(local_360._M_p + 0x18));
              r_code::Atom::operator=(&pCVar14->atom,&this_02->atom);
              std::__cxx11::string::_M_assign((string *)&pCVar14->str_opcode);
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              operator=(&pCVar14->things_to_read,&this_02->things_to_read);
              IVar5 = this_02->use_as;
              pCVar14->type = this_02->type;
              pCVar14->use_as = IVar5;
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                      &local_3b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_p != &local_3c0) {
                operator_delete(local_3d0._M_p);
              }
              r_code::Atom::~Atom((Atom *)local_3d8);
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector(&local_88);
              this = (Preprocessor *)local_360._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                operator_delete(local_1b8._M_dataplus._M_p);
              }
              this_04 = local_344;
            }
            r_code::Atom::~Atom(this_04);
            this->m_classOpcode = this->m_classOpcode + 1;
            r_code::Atom::~Atom((Atom *)&local_42c);
            std::__cxx11::
            _List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::_M_clear(&local_2c0);
          }
          if ((pointer)local_338._0_8_ != (pointer)(local_338 + 0x10)) {
            operator_delete((void *)local_338._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p != &local_428.field_2) {
            operator_delete(local_428._M_dataplus._M_p);
          }
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)psVar15);
          if (iVar7 == 0) {
            local_378 = (undefined1  [8])local_378;
            local_368 = (pointer)0x0;
            local_2f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_408;
            local_2f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = local_400._M_pi;
            if ((Preprocessor *)local_400._M_pi != (Preprocessor *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &(local_400._M_pi)->_M_use_count)->_M_pi =
                     *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                              &(local_400._M_pi)->_M_use_count)->_M_pi + 1;
                UNLOCK();
              }
              else {
                *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &(local_400._M_pi)->_M_use_count)->_M_pi =
                     *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                              &(local_400._M_pi)->_M_use_count)->_M_pi + 1;
              }
            }
            pSStack_370 = (pointer)local_378;
            getMembers(this,&local_2f0,&local_3f8,
                       (list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                        *)local_378,false);
            this_03._M_pi =
                 local_2f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if ((Preprocessor *)
                local_2f0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (Preprocessor *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_2f0.
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            this_01._M_pi = local_400._M_pi;
            local_300._M_allocated_capacity = (size_type)local_408;
            local_300._8_8_ = local_400._M_pi;
            if ((Preprocessor *)local_400._M_pi == (Preprocessor *)0x0) {
              t = getReturnType((Preprocessor *)this_03._M_pi,(Ptr *)&local_300);
            }
            else {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &(local_400._M_pi)->_M_use_count)->_M_pi =
                     *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                              &(local_400._M_pi)->_M_use_count)->_M_pi + 1;
                UNLOCK();
                t = getReturnType((Preprocessor *)this_03._M_pi,(Ptr *)&local_300);
                if ((Preprocessor *)this_01._M_pi == (Preprocessor *)0x0) goto LAB_00137452;
              }
              else {
                *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &(local_400._M_pi)->_M_use_count)->_M_pi =
                     *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                              &(local_400._M_pi)->_M_use_count)->_M_pi + 1;
                t = getReturnType((Preprocessor *)this_03._M_pi,(Ptr *)&local_300);
              }
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
            }
LAB_00137452:
            local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
            pcVar4 = (local_408->cmd)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_428,pcVar4,pcVar4 + (local_408->cmd)._M_string_length);
            local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2a8,local_428._M_dataplus._M_p,
                       local_428._M_dataplus._M_p + local_428._M_string_length);
            this = (Preprocessor *)local_360._M_p;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_248->m_vector,&local_2a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
              operator_delete(local_2a8._M_dataplus._M_p);
            }
            r_code::Atom::Operator((ushort)local_350,(uchar)local_314);
            local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_218,local_428._M_dataplus._M_p,
                       local_428._M_dataplus._M_p + local_428._M_string_length);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                      (&local_d0,&local_3f8);
            Class::Class((Class *)local_3d8,local_350,&local_218,&local_d0,t);
            pmVar9 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)local_3e0,&local_428);
            r_code::Atom::operator=(&pmVar9->atom,(Atom *)local_3d8);
            std::__cxx11::string::operator=((string *)&pmVar9->str_opcode,(string *)&local_3d0);
            local_338._16_8_ =
                 (pmVar9->things_to_read).
                 super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_338._0_8_ =
                 (pmVar9->things_to_read).
                 super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_338._8_8_ =
                 (pmVar9->things_to_read).
                 super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            (pmVar9->things_to_read).
            super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_3b0._M_allocated_capacity;
            (pmVar9->things_to_read).
            super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)local_3b0._8_8_;
            (pmVar9->things_to_read).
            super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = local_3a0;
            local_3b0._M_allocated_capacity = 0;
            local_3b0._8_8_ = (pointer)0x0;
            local_3a0 = (pointer)0x0;
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       local_338);
            *(pointer *)&pmVar9->type = local_398._M_p;
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                       &local_3b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_p != &local_3c0) {
              operator_delete(local_3d0._M_p);
            }
            r_code::Atom::~Atom((Atom *)local_3d8);
            std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                      (&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p);
            }
            r_code::Atom::~Atom(local_350);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._M_dataplus._M_p != &local_428.field_2) {
              operator_delete(local_428._M_dataplus._M_p);
            }
            local_314 = local_314 + 1;
            std::__cxx11::
            _List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::_M_clear((_List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                        *)local_378);
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)psVar15);
            if (iVar7 == 0) {
              local_378 = (undefined1  [8])0x0;
              pSStack_370 = (pointer)0x0;
              local_368 = (pointer)0x0;
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"","");
              local_178[0] = local_168;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"","");
              StructureMember::StructureMember
                        ((StructureMember *)local_3d8,(_Read)Compiler::read_set,(string *)0x0,
                         &local_158,(Iteration)(string *)local_178);
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              emplace_back<r_comp::StructureMember>
                        ((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                          *)local_378,(StructureMember *)local_3d8);
              if (local_398._M_p != local_388) {
                operator_delete(local_398._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3c0._M_allocated_capacity != &local_3b0) {
                operator_delete((void *)local_3c0._M_allocated_capacity);
              }
              if (local_178[0] != local_168) {
                operator_delete(local_178[0]);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p);
              }
              local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
              pcVar4 = (local_408->cmd)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_428,pcVar4,pcVar4 + (local_408->cmd)._M_string_length);
              local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_198,local_428._M_dataplus._M_p,
                         local_428._M_dataplus._M_p + local_428._M_string_length);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_260->m_vector,&local_198);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_dataplus._M_p != &local_198.field_2) {
                operator_delete(local_198._M_dataplus._M_p);
              }
              r_code::Atom::DeviceFunction((ushort)local_354);
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_238,local_428._M_dataplus._M_p,
                         local_428._M_dataplus._M_p + local_428._M_string_length);
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
                        (&local_e8,
                         (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                          *)local_378);
              Class::Class((Class *)local_3d8,local_354,&local_238,&local_e8,ANY);
              pmVar9 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)local_3e0,&local_428);
              r_code::Atom::operator=(&pmVar9->atom,(Atom *)local_3d8);
              std::__cxx11::string::operator=((string *)&pmVar9->str_opcode,(string *)&local_3d0);
              local_338._16_8_ =
                   (pmVar9->things_to_read).
                   super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_338._0_8_ =
                   (pmVar9->things_to_read).
                   super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_338._8_8_ =
                   (pmVar9->things_to_read).
                   super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              (pmVar9->things_to_read).
              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)local_3b0._M_allocated_capacity;
              (pmVar9->things_to_read).
              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)local_3b0._8_8_;
              (pmVar9->things_to_read).
              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = local_3a0;
              local_3b0._M_allocated_capacity = 0;
              local_3b0._8_8_ = (pointer)0x0;
              local_3a0 = (pointer)0x0;
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                      local_338);
              *(pointer *)&pmVar9->type = local_398._M_p;
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                      &local_3b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_p != &local_3c0) {
                operator_delete(local_3d0._M_p);
              }
              r_code::Atom::~Atom((Atom *)local_3d8);
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector(&local_e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p);
              }
              r_code::Atom::~Atom(local_354);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_428._M_dataplus._M_p != &local_428.field_2) {
                operator_delete(local_428._M_dataplus._M_p);
              }
              local_308 = (ulong)((int)local_308 + 1);
              std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::
              ~vector((vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
                      local_378);
            }
          }
        }
        std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                  (&local_3f8);
        if ((Preprocessor *)local_400._M_pi != (Preprocessor *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
        }
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar16 = psVar16 + 1;
    } while (psVar16 != local_240);
  }
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_288);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_138);
  return;
}

Assistant:

void Preprocessor::initialize(Metadata *metadata)
{
    this->m_metadata = metadata;
    m_classOpcode = 0;
    uint16_t function_opcode = 0;
    uint16_t operator_opcode = 0;
    std::vector<StructureMember> r_xpr;
    metadata->classes[std::string(Class::Expression)] = Class(Atom::Object(m_classOpcode, 0), Class::Expression, r_xpr); // to read unspecified expressions in classes and sets.
    ++m_classOpcode;
    std::vector<StructureMember> r_type;
    metadata->classes[std::string(Class::Type)] = Class(Atom::Object(m_classOpcode, 0), Class::Type, r_type); // to read object types in expressions and sets.
    ++m_classOpcode;

    for (RepliStruct::Ptr replistruct : root->args) {
        if (replistruct->type != RepliStruct::Directive) {
            continue;
        }

        RepliStruct::Ptr s = replistruct->args.front();
        std::vector<StructureMember> members;

        if (replistruct->cmd == "!class") {
            std::string sset = "[]";
            std::string class_name = s->cmd;
            size_t p = class_name.find(sset);
            ClassType class_type = (p == std::string::npos ? T_CLASS : T_SET);

            if (class_type == T_SET) { // remove the trailing [] since the RepliStructs for instantiated classes do so.
                class_name = class_name.substr(0, class_name.length() - sset.length());
            }

            if (isTemplateClass(s)) {
                m_templateClasses[class_name] = s;
                continue;
            }

            std::list<RepliStruct::Ptr> tpl_args;
            getMembers(s, members, tpl_args, false);
            Atom atom;

            if (class_name == "grp") {
                atom = Atom::Group(m_classOpcode, members.size());
            } else if (class_name == "ipgm") {
                atom = Atom::InstantiatedProgram(m_classOpcode, members.size());
            } else if (class_name == "icpp_pgm") {
                atom = Atom::InstantiatedCPPProgram(m_classOpcode, members.size());
            } else if (class_name == "cst") {
                atom = Atom::CompositeState(m_classOpcode, members.size());
            } else if (class_name == "mdl") {
                atom = Atom::Model(m_classOpcode, members.size());
            } else if (class_name.find("mk.") != std::string::npos) {
                atom = Atom::Marker(m_classOpcode, members.size());
            } else {
                atom = Atom::Object(m_classOpcode, members.size());
            }

            if (class_type == T_CLASS) { // find out if the class is a sys class, i.e. is an instantiation of _obj, _grp or _fact.
                std::string base_class = s->args.front()->cmd;

                if (base_class == "_obj" || base_class == "_grp" || base_class == "_fact") {
                    class_type = T_SYS_CLASS;
                }
            }

            metadata->class_names[m_classOpcode] = class_name;

            switch (class_type) {
            case T_SYS_CLASS:
                metadata->classes_by_opcodes[m_classOpcode] = metadata->classes[class_name] = metadata->sys_classes[class_name] = Class(atom, class_name, members);
                break;

            case T_CLASS:
                metadata->classes_by_opcodes[m_classOpcode] = metadata->classes[class_name] = Class(atom, class_name, members);
                break;

            case T_SET:
                metadata->classes_by_opcodes[m_classOpcode] = metadata->classes[class_name] = Class(Atom::SSet(m_classOpcode, members.size()), class_name, members);
                break;

            default:
                break;
            }

            ++m_classOpcode;
        } else if (replistruct->cmd == "!op") {
            std::list<RepliStruct::Ptr> tpl_args;
            getMembers(s, members, tpl_args, false);
            ReturnType return_type = getReturnType(s);
            std::string operator_name = s->cmd;
            metadata->operator_names.push_back(operator_name);
            metadata->classes[operator_name] = Class(Atom::Operator(operator_opcode, s->args.size()), operator_name, members, return_type);
            ++operator_opcode;
        } else if (replistruct->cmd == "!dfn") { // don't bother to read the members, it's always a set.
            std::vector<StructureMember> r_set;
            r_set.push_back(StructureMember(&Compiler::read_set, ""));
            std::string function_name = s->cmd;
            metadata->function_names.push_back(function_name);
            metadata->classes[function_name] = Class(Atom::DeviceFunction(function_opcode), function_name, r_set);
            ++function_opcode;
        }
    }
}